

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.c
# Opt level: O0

int32 vector_mean(float32 *mean,float32 **data,int32 n_vec,int32 n_dim)

{
  float64 f;
  int32 j;
  int32 i;
  int32 n_dim_local;
  int32 n_vec_local;
  float32 **data_local;
  float32 *mean_local;
  
  if ((0 < n_vec) && (0 < n_dim)) {
    for (f._4_4_ = 0; f._4_4_ < n_dim; f._4_4_ = f._4_4_ + 1) {
      mean[f._4_4_] = 0.0;
    }
    for (f._4_4_ = 0; f._4_4_ < n_vec; f._4_4_ = f._4_4_ + 1) {
      for (f._0_4_ = 0; f._0_4_ < n_dim; f._0_4_ = f._0_4_ + 1) {
        mean[f._0_4_] = (float32)((float)data[f._4_4_][f._0_4_] + (float)mean[f._0_4_]);
      }
    }
    for (f._4_4_ = 0; f._4_4_ < n_dim; f._4_4_ = f._4_4_ + 1) {
      mean[f._4_4_] = (float32)((1.0 / (float)n_vec) * (float)mean[f._4_4_]);
    }
    return 0;
  }
  __assert_fail("(n_vec > 0) && (n_dim > 0)",
                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/sphinx3_align/vector.c"
                ,0x129,"int32 vector_mean(float32 *, float32 **, int32, int32)");
}

Assistant:

int32
vector_mean(float32 * mean, float32 ** data, int32 n_vec, int32 n_dim)
{
    int32 i, j;
    float64 f;

    assert((n_vec > 0) && (n_dim > 0));

    for (i = 0; i < n_dim; i++)
        mean[i] = 0.0;

    for (i = 0; i < n_vec; i++) {
        for (j = 0; j < n_dim; j++)
            mean[j] += data[i][j];
    }

    f = 1.0 / (float64) n_vec;
    for (i = 0; i < n_dim; i++)
        mean[i] *= (float32) f;

    return 0;
}